

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O0

ostream * GenApi_3_4::operator<<(ostream *os,CFeatureBag *FeatureBag)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  ostream *poVar4;
  gcstring *pgVar5;
  char *pcVar6;
  long lVar7;
  ostream *in_RDI;
  bool isFirst;
  gcstring Value;
  gcstring Name;
  const_iterator end;
  const_iterator it;
  gcstring local_170 [80];
  gcstring local_120 [83];
  byte local_cd;
  gcstring local_c0 [80];
  gcstring local_70 [80];
  const_iterator local_20 [8];
  const_iterator local_18 [16];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::operator<<(in_RDI,"# {05D8C294-F295-4dfb-9D01-096BD04049F4}\n");
  plVar2 = (long *)GenApi_3_4::CFeatureBag::GetInfo();
  uVar3 = (**(code **)(*plVar2 + 0x50))();
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<(local_8,"# GenApi persistence file (version ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    std::operator<<(poVar4,")\n");
    poVar4 = std::operator<<(local_8,"# ");
    pgVar5 = (gcstring *)GenApi_3_4::CFeatureBag::GetInfo();
    pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(pgVar5);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::operator<<(poVar4,"\n");
  }
  GenApi_3_4::CFeatureBag::GetBegin();
  GenApi_3_4::CFeatureBag::GetEnd();
  while( true ) {
    uVar3 = GenApi_3_4::CFeatureBag::const_iterator::operator!=(local_18,local_20);
    if ((uVar3 & 1) == 0) break;
    pgVar5 = (gcstring *)GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
    GenICam_3_4::gcstring::gcstring(local_70,pgVar5);
    lVar7 = GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
    GenICam_3_4::gcstring::gcstring(local_c0,(gcstring *)(lVar7 + 0x50));
    GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
    bVar1 = GenApi_3_4::CSelectorState::IsEmpty();
    poVar4 = local_8;
    if ((bVar1 & 1) == 0) {
      local_cd = 1;
      pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_70);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::operator<<(poVar4,"\t{");
      GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
      GenApi_3_4::CSelectorState::SetFirst();
      do {
        if ((local_cd & 1) == 0) {
          std::operator<<(local_8,"\t");
        }
        else {
          local_cd = 0;
        }
        poVar4 = local_8;
        GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
        GenApi_3_4::CSelectorState::GetNodeName();
        pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_120);
        poVar4 = std::operator<<(poVar4,pcVar6);
        poVar4 = std::operator<<(poVar4,"=");
        GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
        GenApi_3_4::CSelectorState::GetNodeValue();
        pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_170);
        std::operator<<(poVar4,pcVar6);
        GenICam_3_4::gcstring::~gcstring(local_170);
        GenICam_3_4::gcstring::~gcstring(local_120);
        GenApi_3_4::CFeatureBag::const_iterator::operator->(local_18);
        bVar1 = GenApi_3_4::CSelectorState::SetNext();
      } while ((bVar1 & 1) != 0);
      poVar4 = std::operator<<(local_8,"}\t");
      pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_c0);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::operator<<(poVar4,"\n");
    }
    else {
      pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_70);
      poVar4 = std::operator<<(poVar4,pcVar6);
      poVar4 = std::operator<<(poVar4,"\t");
      pcVar6 = GenICam_3_4::gcstring::operator_cast_to_char_(local_c0);
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::operator<<(poVar4,"\n");
    }
    GenICam_3_4::gcstring::~gcstring(local_c0);
    GenICam_3_4::gcstring::~gcstring(local_70);
    GenApi_3_4::CFeatureBag::const_iterator::operator++(local_18);
  }
  return local_8;
}

Assistant:

inline std::ostream& operator <<(std::ostream &os, const CFeatureBag &FeatureBag)
    {
        os << "# " GENAPI_PERSISTENCE_MAGIC "\n";
        if( !FeatureBag.GetInfo().empty() )
        {
            os << "# GenApi persistence file (version " << GENAPI_VERSION_MAJOR << "." << GENAPI_VERSION_MINOR << "." << GENAPI_VERSION_SUBMINOR << ")\n";
            os << "# " << FeatureBag.GetInfo() << "\n";
        }
        for (
            CFeatureBag::const_iterator it = FeatureBag.GetBegin(), end = FeatureBag.GetEnd();
            it != end;
            ++it
            )
        {
            const GENICAM_NAMESPACE::gcstring Name(it->name);
            const GENICAM_NAMESPACE::gcstring Value(it->value);
            if ((it->pState)->IsEmpty())
            {
                os << Name << "\t" << Value << "\n";
            }
            else
            {
                bool isFirst = true;
                os << Name << "\t{";
                (it->pState)->SetFirst();
                do
                {
                    if (!isFirst)
                        os << "\t";
                    else
                        isFirst = false;
                    os << (it->pState)->GetNodeName() << "=" << (it->pState)->GetNodeValue();
                } while ((it->pState)->SetNext());
                os << "}\t" << Value << "\n";
            }
        }

        return os;
    }